

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [7],uint *ts_1,
          char (*ts_2) [2],uint *ts_3)

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::join_helper<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
            (&local_1120,(char (*) [7])this,(uint *)ts,(char (*) [2])ts_1,(uint *)ts_2);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}